

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

uint __thiscall llvm::yaml::Input::beginSequence(Input *this)

{
  HNode *hnode;
  bool bVar1;
  ret_type pSVar2;
  ret_type pSVar3;
  size_t extraout_RDX;
  uint uVar4;
  StringRef S;
  Twine local_40;
  
  pSVar2 = dyn_cast<llvm::yaml::Input::SequenceHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
  if (pSVar2 == (ret_type)0x0) {
    bVar1 = isa_impl_wrap<llvm::yaml::Input::EmptyHNode,_llvm::yaml::Input::HNode_*const,_const_llvm::yaml::Input::HNode_*>
            ::doit(&this->CurrentNode);
    uVar4 = 0;
    if (!bVar1) {
      pSVar3 = dyn_cast<llvm::yaml::Input::ScalarHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
      if ((pSVar3 != (ret_type)0x0) &&
         (S.Length = extraout_RDX, S.Data = (char *)(pSVar3->_value).Length,
         bVar1 = isNull((yaml *)(pSVar3->_value).Data,S), bVar1)) {
        return 0;
      }
      hnode = this->CurrentNode;
      Twine::Twine(&local_40,"not a sequence");
      setError(this,hnode,&local_40);
      uVar4 = 0;
    }
  }
  else {
    uVar4 = (uint)((ulong)((long)(pSVar2->Entries).
                                 super__Vector_base<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pSVar2->Entries).
                                super__Vector_base<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
  }
  return uVar4;
}

Assistant:

unsigned Input::beginSequence() {
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode))
    return SQ->Entries.size();
  if (isa<EmptyHNode>(CurrentNode))
    return 0;
  // Treat case where there's a scalar "null" value as an empty sequence.
  if (ScalarHNode *SN = dyn_cast<ScalarHNode>(CurrentNode)) {
    if (isNull(SN->value()))
      return 0;
  }
  // Any other type of HNode is an error.
  setError(CurrentNode, "not a sequence");
  return 0;
}